

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

bool __thiscall draco::CornerTable::ComputeOppositeCorners(CornerTable *this,int *num_vertices)

{
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar1;
  pointer pIVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar6;
  VertexEdgePair *__cur;
  ulong uVar7;
  pointer pVVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  CornerIndex c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar14;
  ulong uVar15;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar16;
  CornerTable *pCVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  allocator_type local_d5;
  int local_d4;
  CornerTable *local_d0;
  pointer local_c8;
  uint local_bc;
  vector<int,_std::allocator<int>_> num_corners_on_vertices;
  vector<VertexEdgePair,_std::allocator<VertexEdgePair>_> local_90;
  long local_78;
  int *local_70;
  pointer local_68;
  CornerIndex *local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> vertex_offset;
  
  if (num_vertices != (int *)0x0) {
    local_70 = num_vertices;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::resize(&(this->opposite_corners_).vector_,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (value_type *)&kInvalidCornerIndex);
    num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0 = this;
    std::vector<int,_std::allocator<int>_>::reserve
              (&num_corners_on_vertices,
               (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->corner_to_vertex_map_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
    uVar15 = 0;
    pCVar17 = local_d0;
    while( true ) {
      pIVar2 = (pCVar17->corner_to_vertex_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(pCVar17->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2;
      uVar13 = uVar7 >> 2;
      if ((uVar13 & 0xffffffff) <= uVar15) break;
      IVar14.value_ = pIVar2[uVar15].value_;
      if ((uint)((ulong)((long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) <= IVar14.value_) {
        local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)local_90.
                              super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::resize
                  (&num_corners_on_vertices,(ulong)(IVar14.value_ + 1),
                   (value_type_conflict1 *)&local_90);
        pCVar17 = local_d0;
      }
      num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[IVar14.value_] =
           num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[IVar14.value_] + 1;
      uVar15 = uVar15 + 1;
    }
    uVar15 = (ulong)(int)uVar13;
    if (uVar15 >> 0x3c != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    if (uVar7 * 0x40000000 >> 0x20 == 0) {
      pVVar8 = (pointer)0x0;
    }
    else {
      pVVar8 = (pointer)operator_new(uVar15 * 8);
    }
    local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pVVar8 + uVar15;
    local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar8;
    while (bVar22 = uVar15 != 0, uVar15 = uVar15 - 1, bVar22) {
      (local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
       super__Vector_impl_data._M_finish)->sink_vert = 0xffffffff;
      (local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
       super__Vector_impl_data._M_finish)->edge_corner = 0xffffffff;
      local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_90.super__Vector_base<VertexEdgePair,_std::allocator<VertexEdgePair>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar8;
    std::vector<int,_std::allocator<int>_>::vector
              (&vertex_offset,
               (long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_d5);
    num_vertices = local_70;
    local_c8 = num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_78 = (long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    iVar11 = 0;
    for (lVar9 = 0; local_78 != lVar9; lVar9 = lVar9 + 1) {
      vertex_offset.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = iVar11;
      iVar11 = iVar11 + num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar9];
    }
    pIVar2 = (local_d0->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (ulong)((long)(local_d0->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 2;
    local_68 = (local_d0->opposite_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = local_d0->num_degenerated_faces_;
    local_60 = &pVVar8->edge_corner;
    uVar4 = 0;
LAB_0012a605:
    do {
      uVar10 = uVar4;
      if ((uint)local_58 <= uVar10) goto LAB_0012a7d2;
      uVar4 = uVar10 + 1;
      uVar5 = uVar10 - 2;
      if (uVar4 % 3 != 0) {
        uVar5 = uVar4;
      }
      IVar14.value_ = 0xffffffff;
      if (uVar5 != 0xffffffff) {
        IVar14.value_ = pIVar2[uVar5].value_;
      }
      uVar15 = (ulong)uVar10;
      IVar1.value_ = pIVar2[uVar15].value_;
      if (uVar10 % 3 != 0) {
        IVar6.value_ = pIVar2[uVar10 - 1].value_;
LAB_0012a679:
        iVar12 = num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[IVar6.value_];
        lVar9 = (long)vertex_offset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[IVar6.value_];
        iVar18 = 0;
        if (0 < iVar12) {
          iVar18 = iVar12;
        }
        lVar21 = lVar9 << 0x20;
        lVar19 = 1;
        lVar20 = 0;
        while ((local_d4 = iVar11, local_bc = IVar6.value_, local_50 = uVar15, iVar18 != (int)lVar20
               && (local_60[lVar9 * 2 + lVar20 * 2 + -1].value_ != 0xffffffff))) {
          if (local_60[lVar9 * 2 + lVar20 * 2 + -1].value_ == IVar14.value_) {
            uVar5 = local_60[lVar9 * 2 + lVar20 * 2].value_;
            uVar7 = (ulong)uVar5;
            IVar16.value_ = 0xffffffff;
            if (uVar7 != 0xffffffff) {
              IVar16.value_ = pIVar2[uVar7].value_;
            }
            if (IVar1.value_ != IVar16.value_) goto LAB_0012a714;
          }
          lVar20 = lVar20 + 1;
          lVar21 = lVar21 + 0x100000000;
          lVar19 = lVar19 + 1;
        }
        goto LAB_0012a767;
      }
      IVar6.value_ = 0xffffffff;
      if (uVar10 + 2 != 0xffffffff) {
        IVar6.value_ = pIVar2[uVar10 + 2].value_;
      }
      if (((IVar1.value_ != IVar14.value_) && (IVar1.value_ != IVar6.value_)) &&
         (IVar14.value_ != IVar6.value_)) goto LAB_0012a679;
      iVar11 = iVar11 + 1;
      local_d0->num_degenerated_faces_ = iVar11;
      uVar4 = uVar10 + 3;
    } while( true );
  }
LAB_0012a802:
  return num_vertices != (int *)0x0;
  while( true ) {
    lVar3 = lVar9 + lVar19;
    pVVar8[lVar9 + lVar19 + -1] = pVVar8[lVar3];
    lVar19 = lVar19 + 1;
    lVar21 = lVar20 + 0x100000000;
    if (pVVar8[lVar3].sink_vert.value_ == 0xffffffff) break;
LAB_0012a714:
    lVar20 = lVar21;
    if (iVar12 <= (int)lVar19) break;
  }
  *(undefined4 *)((long)&(pVVar8->sink_vert).value_ + (lVar20 >> 0x1d)) = 0xffffffff;
  if (uVar5 == 0xffffffff) {
LAB_0012a767:
    iVar12 = num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[IVar14.value_];
    iVar18 = vertex_offset.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[IVar14.value_];
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    for (lVar9 = 0; iVar12 != (int)lVar9; lVar9 = lVar9 + 1) {
      if (pVVar8[iVar18 + lVar9].sink_vert.value_ == 0xffffffff) {
        pVVar8[iVar18 + lVar9].sink_vert.value_ = IVar6.value_;
        pVVar8[iVar18 + lVar9].edge_corner.value_ = uVar10;
        break;
      }
    }
  }
  else {
    local_68[uVar15].value_ = uVar5;
    local_68[uVar7].value_ = uVar10;
  }
  goto LAB_0012a605;
LAB_0012a7d2:
  *local_70 = (int)local_78;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vertex_offset.super__Vector_base<int,_std::allocator<int>_>);
  std::vector<VertexEdgePair,_std::allocator<VertexEdgePair>_>::~vector(&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&num_corners_on_vertices.super__Vector_base<int,_std::allocator<int>_>);
  goto LAB_0012a802;
}

Assistant:

bool CornerTable::ComputeOppositeCorners(int *num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  if (num_vertices == nullptr) {
    return false;
  }
  opposite_corners_.resize(num_corners(), kInvalidCornerIndex);

  // Out implementation for finding opposite corners is based on keeping track
  // of outgoing half-edges for each vertex of the mesh. Half-edges (defined by
  // their opposite corners) are processed one by one and whenever a new
  // half-edge (corner) is processed, we check whether the sink vertex of
  // this half-edge contains its sibling half-edge. If yes, we connect them and
  // remove the sibling half-edge from the sink vertex, otherwise we add the new
  // half-edge to its source vertex.

  // First compute the number of outgoing half-edges (corners) attached to each
  // vertex.
  std::vector<int> num_corners_on_vertices;
  num_corners_on_vertices.reserve(num_corners());
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex v1 = Vertex(c);
    if (v1.value() >= static_cast<int>(num_corners_on_vertices.size())) {
      num_corners_on_vertices.resize(v1.value() + 1, 0);
    }
    // For each corner there is always exactly one outgoing half-edge attached
    // to its vertex.
    num_corners_on_vertices[v1.value()]++;
  }

  // Create a storage for half-edges on each vertex. We store all half-edges in
  // one array, where each entry is identified by the half-edge's sink vertex id
  // and the associated half-edge corner id (corner opposite to the half-edge).
  // Each vertex will be assigned storage for up to
  // |num_corners_on_vertices[vert_id]| half-edges. Unused half-edges are marked
  // with |sink_vert| == kInvalidVertexIndex.
  struct VertexEdgePair {
    VertexEdgePair()
        : sink_vert(kInvalidVertexIndex), edge_corner(kInvalidCornerIndex) {}
    VertexIndex sink_vert;
    CornerIndex edge_corner;
  };
  std::vector<VertexEdgePair> vertex_edges(num_corners(), VertexEdgePair());

  // For each vertex compute the offset (location where the first half-edge
  // entry of a given vertex is going to be stored). This way each vertex is
  // guaranteed to have a non-overlapping storage with respect to the other
  // vertices.
  std::vector<int> vertex_offset(num_corners_on_vertices.size());
  int offset = 0;
  for (size_t i = 0; i < num_corners_on_vertices.size(); ++i) {
    vertex_offset[i] = offset;
    offset += num_corners_on_vertices[i];
  }

  // Now go over the all half-edges (using their opposite corners) and either
  // insert them to the |vertex_edge| array or connect them with existing
  // half-edges.
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex tip_v = Vertex(c);
    const VertexIndex source_v = Vertex(Next(c));
    const VertexIndex sink_v = Vertex(Previous(c));

    const FaceIndex face_index = Face(c);
    if (c == FirstCorner(face_index)) {
      // Check whether the face is degenerated, if so ignore it.
      const VertexIndex v0 = Vertex(c);
      if (v0 == source_v || v0 == sink_v || source_v == sink_v) {
        ++num_degenerated_faces_;
        c += 2;  // Ignore the next two corners of the same face.
        continue;
      }
    }

    CornerIndex opposite_c(kInvalidCornerIndex);
    // The maximum number of half-edges attached to the sink vertex.
    const int num_corners_on_vert = num_corners_on_vertices[sink_v.value()];
    // Where to look for the first half-edge on the sink vertex.
    offset = vertex_offset[sink_v.value()];
    for (int i = 0; i < num_corners_on_vert; ++i, ++offset) {
      const VertexIndex other_v = vertex_edges[offset].sink_vert;
      if (other_v == kInvalidVertexIndex) {
        break;  // No matching half-edge found on the sink vertex.
      }
      if (other_v == source_v) {
        if (tip_v == Vertex(vertex_edges[offset].edge_corner)) {
          continue;  // Don't connect mirrored faces.
        }
        // A matching half-edge was found on the sink vertex. Mark the
        // half-edge's opposite corner.
        opposite_c = vertex_edges[offset].edge_corner;
        // Remove the half-edge from the sink vertex. We remap all subsequent
        // half-edges one slot down.
        // TODO(ostava): This can be optimized a little bit, by remapping only
        // the half-edge on the last valid slot into the deleted half-edge's
        // slot.
        for (int j = i + 1; j < num_corners_on_vert; ++j, ++offset) {
          vertex_edges[offset] = vertex_edges[offset + 1];
          if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
            break;  // Unused half-edge reached.
          }
        }
        // Mark the last entry as unused.
        vertex_edges[offset].sink_vert = kInvalidVertexIndex;
        break;
      }
    }
    if (opposite_c == kInvalidCornerIndex) {
      // No opposite corner found. Insert the new edge
      const int num_corners_on_source_vert =
          num_corners_on_vertices[source_v.value()];
      offset = vertex_offset[source_v.value()];
      for (int i = 0; i < num_corners_on_source_vert; ++i, ++offset) {
        // Find the first unused half-edge slot on the source vertex.
        if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
          vertex_edges[offset].sink_vert = sink_v;
          vertex_edges[offset].edge_corner = c;
          break;
        }
      }
    } else {
      // Opposite corner found.
      opposite_corners_[c] = opposite_c;
      opposite_corners_[opposite_c] = c;
    }
  }
  *num_vertices = static_cast<int>(num_corners_on_vertices.size());
  return true;
}